

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O2

void __thiscall Assimp::FBX::MeshGeometry::ReadLayerElement(MeshGeometry *this,Scope *layerElement)

{
  int index;
  int iVar1;
  Element *el;
  Element *el_00;
  Token *pTVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  *this_00;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
  _Var3;
  Scope *source;
  Token *t;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  pVar4;
  string sStack_1b8;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"Type",(allocator<char> *)&sStack_1b8);
  el = GetRequiredElement(layerElement,(string *)&local_198,(Element *)0x0);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"TypedIndex",(allocator<char> *)&sStack_1b8);
  el_00 = GetRequiredElement(layerElement,(string *)&local_198,(Element *)0x0);
  std::__cxx11::string::~string((string *)&local_198);
  pTVar2 = GetRequiredToken(el,0);
  ParseTokenAsString_abi_cxx11_(&sStack_1b8,(FBX *)pTVar2,t);
  pTVar2 = GetRequiredToken(el_00,0);
  index = ParseTokenAsInt(pTVar2);
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
             *)GetRequiredScope((this->super_Geometry).super_Object.element);
  pVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::equal_range(this_00,&sStack_1b8);
  _Var3 = pVar4.first._M_node;
  do {
    if (_Var3._M_node == pVar4.second._M_node._M_node) {
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[41]>
                (&local_198,(char (*) [41])"failed to resolve vertex layer element: ");
      std::operator<<((ostream *)&local_198,(string *)&sStack_1b8);
      std::operator<<((ostream *)&local_198,", index: ");
      std::ostream::operator<<(&local_198,index);
      LogFunctions<Assimp::FBXImporter>::LogError(&local_198);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
LAB_0052ba65:
      std::__cxx11::string::~string((string *)&sStack_1b8);
      return;
    }
    pTVar2 = GetRequiredToken(*(Element **)(_Var3._M_node + 2),0);
    iVar1 = ParseTokenAsInt(pTVar2);
    if (iVar1 == index) {
      source = GetRequiredScope(*(Element **)(_Var3._M_node + 2));
      ReadVertexData(this,&sStack_1b8,index,source);
      goto LAB_0052ba65;
    }
    _Var3._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var3._M_node);
  } while( true );
}

Assistant:

void MeshGeometry::ReadLayerElement(const Scope& layerElement)
{
    const Element& Type = GetRequiredElement(layerElement,"Type");
    const Element& TypedIndex = GetRequiredElement(layerElement,"TypedIndex");

    const std::string& type = ParseTokenAsString(GetRequiredToken(Type,0));
    const int typedIndex = ParseTokenAsInt(GetRequiredToken(TypedIndex,0));

    const Scope& top = GetRequiredScope(element);
    const ElementCollection candidates = top.GetCollection(type);

    for (ElementMap::const_iterator it = candidates.first; it != candidates.second; ++it) {
        const int index = ParseTokenAsInt(GetRequiredToken(*(*it).second,0));
        if(index == typedIndex) {
            ReadVertexData(type,typedIndex,GetRequiredScope(*(*it).second));
            return;
        }
    }

    FBXImporter::LogError(Formatter::format("failed to resolve vertex layer element: ")
        << type << ", index: " << typedIndex);
}